

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void testPacking(void)

{
  printf("s0 = %d; s1 = %d; s2 = %d; s4 = %d; s8 = %d\n",0x18,10,0xc,0x10,0x18);
  return;
}

Assistant:

void
testPacking() {
	size_t s0 = sizeof(F0);
	size_t s1 = sizeof(F1);
	size_t s2 = sizeof(F2);
	size_t s4 = sizeof(F4);
	size_t s8 = sizeof(F8);

	printf("s0 = %d; s1 = %d; s2 = %d; s4 = %d; s8 = %d\n", s0, s1, s2, s4, s8);
}